

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_test.cxx
# Opt level: O3

int raft_server_test::multiple_config_change_test(void)

{
  uint uVar1;
  int *piVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  int iVar4;
  cmd_result_code cVar5;
  ostream *poVar6;
  pointer psVar7;
  _func_int **pp_Var8;
  int __how;
  int __how_00;
  int __how_01;
  int __how_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  int __fd;
  string *endpoint;
  _func_int *p_Var10;
  initializer_list<RaftPkg_*> __l;
  ptr<FakeNetworkBase> f_base;
  vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  configs_out;
  ptr<cluster_config> c_conf;
  vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> pkgs;
  ptr<raft_result> ret;
  string s3_addr;
  string s2_addr;
  string s1_addr;
  string s4_addr;
  RaftPkg s1;
  RaftPkg s4;
  RaftPkg s3;
  RaftPkg s2;
  undefined1 local_680 [36];
  int local_65c;
  ptr<FakeNetworkBase> local_658;
  vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  local_648;
  undefined1 local_628 [24];
  thread local_610;
  id local_600;
  element_type *local_5f8;
  undefined1 local_5f0 [16];
  string local_5e0;
  string local_5c0;
  string local_5a0;
  string local_580;
  undefined1 local_560 [72];
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_518;
  undefined8 local_418;
  RaftPkg local_408;
  RaftPkg local_2c0;
  RaftPkg local_178;
  
  raft_functional_common::reset_log_files();
  local_658.super___shared_ptr<nuraft::FakeNetworkBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (FakeNetworkBase *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<nuraft::FakeNetworkBase,std::allocator<nuraft::FakeNetworkBase>>
            (&local_658.super___shared_ptr<nuraft::FakeNetworkBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(FakeNetworkBase **)&local_658,
             (allocator<nuraft::FakeNetworkBase> *)(local_560 + 0x10));
  local_5a0._M_dataplus._M_p = (pointer)&local_5a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"S1","");
  local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c0,"S2","");
  local_5e0._M_dataplus._M_p = (pointer)&local_5e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_5f0 + 0x10),"S3","");
  local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_580,"S4","");
  RaftPkg::RaftPkg((RaftPkg *)(local_560 + 0x10),&local_658,1,&local_5a0);
  RaftPkg::RaftPkg(&local_178,&local_658,2,&local_5c0);
  RaftPkg::RaftPkg(&local_2c0,&local_658,3,(string *)(local_5f0 + 0x10));
  RaftPkg::RaftPkg(&local_408,&local_658,4,&local_580);
  __l._M_len = 4;
  __l._M_array = (iterator)local_680;
  local_680._0_8_ = (RaftPkg *)(local_560 + 0x10);
  local_680._8_8_ = &local_178;
  local_680._16_8_ = &local_2c0;
  local_680._24_8_ = &local_408;
  std::vector<RaftPkg_*,_std::allocator<RaftPkg_*>_>::vector
            ((vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> *)(local_628 + 0x10),__l,
             (allocator_type *)&local_648);
  iVar4 = launch_servers((vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> *)(local_628 + 0x10),
                         (raft_params *)0x0,false);
  if (iVar4 == 0) {
    iVar4 = make_group((vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> *)(local_628 + 0x10));
    if (iVar4 == 0) {
      p_Var9 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)local_2c0.sMgr.
                        super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                 0x40))->_M_use_count;
      if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
        }
      }
      nuraft::raft_server::remove_srv((raft_server *)local_560,(int)local_418);
      if (local_560._8_8_ != 0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_560._8_8_);
      }
      if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
      }
      p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_408.sMgr.super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr[9]._vptr_state_mgr;
      if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
        }
      }
      nuraft::raft_server::remove_srv((raft_server *)local_5f0,(int)local_418);
      if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
      }
      cVar5 = nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>
              ::get_result_code((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>
                                 *)local_5f0._0_8_);
      if (cVar5 < OK) {
        pp_Var8 = local_408.sMgr.super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr[8]._vptr_state_mgr;
        p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_408.sMgr.super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr[9]._vptr_state_mgr;
        if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
          }
        }
        nuraft::raft_server::set_priority((raft_server *)local_418,*(int *)pp_Var8,10);
        if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
        }
        local_680._8_8_ = 0;
        local_680._16_8_ = local_680._16_8_ & 0xffffffffffffff00;
        local_680._0_8_ = (RaftPkg *)(local_680 + 0x10);
        nuraft::FakeNetwork::execReqResp((FakeNetwork *)local_518.__d.__r,(string *)local_680);
        if ((RaftPkg *)local_680._0_8_ != (RaftPkg *)(local_680 + 0x10)) {
          operator_delete((void *)local_680._0_8_);
        }
        local_680._8_8_ = 0;
        local_680._16_8_ = local_680._16_8_ & 0xffffffffffffff00;
        local_680._0_8_ = (RaftPkg *)(local_680 + 0x10);
        nuraft::FakeNetwork::execReqResp((FakeNetwork *)local_518.__d.__r,(string *)local_680);
        if ((RaftPkg *)local_680._0_8_ != (RaftPkg *)(local_680 + 0x10)) {
          operator_delete((void *)local_680._0_8_);
        }
        local_680._8_8_ = 0;
        local_680._16_8_ = local_680._16_8_ & 0xffffffffffffff00;
        local_680._0_8_ = (RaftPkg *)(local_680 + 0x10);
        nuraft::FakeNetwork::execReqResp((FakeNetwork *)local_518.__d.__r,(string *)local_680);
        if ((RaftPkg *)local_680._0_8_ != (RaftPkg *)(local_680 + 0x10)) {
          operator_delete((void *)local_680._0_8_);
        }
        endpoint = (string *)local_680;
        local_680._8_8_ = (RaftPkg *)0x0;
        local_680._16_8_ = local_680._16_8_ & 0xffffffffffffff00;
        local_680._0_8_ = (RaftPkg *)(local_680 + 0x10);
        nuraft::FakeNetwork::execReqResp((FakeNetwork *)local_518.__d.__r,endpoint);
        if ((RaftPkg *)local_680._0_8_ != (RaftPkg *)(local_680 + 0x10)) {
          operator_delete((void *)local_680._0_8_);
        }
        iVar4 = wait_for_sm_exec((vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> *)(local_628 + 0x10)
                                 ,(size_t)endpoint);
        __fd = (int)endpoint;
        if (iVar4 == 0) {
          local_600 = local_610._M_id._M_thread;
          p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_628._16_8_;
          if ((id)local_628._16_8_ != local_610._M_id._M_thread) {
            do {
              pp_Var8 = p_Var9->_vptr__Sp_counted_base;
              piVar2 = *(int **)(pp_Var8[0xb] + 0x40);
              p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pp_Var8[0xb] + 0x48);
              if (p_Var3 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                iVar4 = *piVar2;
              }
              else {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
                }
                iVar4 = *piVar2;
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
              }
              if (iVar4 != 3) {
                local_648.
                super__Vector_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_648.
                super__Vector_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_648.
                super__Vector_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                nuraft::raft_server::get_srv_config_all((raft_server *)pp_Var8[0x27],&local_648);
                iVar4 = (int)((ulong)((long)local_648.
                                            super__Vector_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_648.
                                           super__Vector_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 4);
                psVar7 = local_648.
                         super__Vector_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if (iVar4 == 3) {
                  for (; psVar7 != local_648.
                                   super__Vector_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish; psVar7 = psVar7 + 1)
                  {
                    uVar1 = ((psVar7->
                             super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr)->id_;
                    if ((4 < uVar1) || ((0x16U >> (uVar1 & 0x1f) & 1) == 0)) {
                      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
                      std::ostream::put(-0x68);
                      poVar6 = (ostream *)std::ostream::flush();
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar6,"        time: ",0xe);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;30m",7);
                      TestSuite::getTimeString_abi_cxx11_();
                      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                         (poVar6,(char *)local_680._0_8_,local_680._8_8_);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar6,"      thread: ",0xe);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[33m",5);
                      pp_Var8 = poVar6->_vptr_basic_ostream;
                      *(uint *)(&poVar6->field_0x18 + (long)pp_Var8[-3]) =
                           *(uint *)(&poVar6->field_0x18 + (long)pp_Var8[-3]) & 0xffffffb5 | 8;
                      *(undefined8 *)(&poVar6->field_0x10 + (long)pp_Var8[-3]) = 4;
                      p_Var10 = (_func_int *)
                                ((long)&poVar6->_vptr_basic_ostream + (long)pp_Var8[-3]);
                      if ((&poVar6->field_0xe1)[(long)pp_Var8[-3]] == '\0') {
                        std::ios::widen((char)p_Var10);
                        p_Var10[0xe1] = (code)0x1;
                      }
                      p_Var10[0xe0] = (code)0x30;
                      local_628._0_8_ = pthread_self();
                      std::_Hash_bytes(local_628,8,0xc70f6907);
                      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
                      *(uint *)(&poVar6->field_0x18 + (long)poVar6->_vptr_basic_ostream[-3]) =
                           *(uint *)(&poVar6->field_0x18 + (long)poVar6->_vptr_basic_ostream[-3]) &
                           0xffffffb5 | 2;
                      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar6,"          in: ",0xe);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[36m",5);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar6,"multiple_config_change_test",0x1b);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"()\x1b[0m",6);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar6,"          at: ",0xe);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[32m",5);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar6,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                                 ,0x6a);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m:",5);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;35m",7);
                      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x321);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar6,
                                 "    value of: \x1b[1;34ms_conf->get_id() == 1 || s_conf->get_id() == 2 || s_conf->get_id() == 4\x1b[0m\n"
                                 ,0x61);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar6,"    expected: \x1b[1;32m",0x15);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"true",4);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m\n",5);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar6,"      actual: \x1b[1;31m",0x15);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"false",5);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m\n",5);
                      if ((RaftPkg *)local_680._0_8_ != (RaftPkg *)(local_680 + 0x10)) {
                        operator_delete((void *)local_680._0_8_);
                      }
                      TestSuite::failHandler();
                      goto LAB_0011f4bb;
                    }
                  }
                  endpoint = (string *)pp_Var8[0x27];
                  nuraft::raft_server::get_config((raft_server *)local_628);
                  pp_Var8 = (_func_int **)(local_628._0_8_ + 0x38);
                  do {
                    pp_Var8 = (_func_int **)*pp_Var8;
                    p_Var10 = pp_Var8[2];
                  } while (*(int *)p_Var10 != 4);
                  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pp_Var8[3];
                  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
                    }
                  }
                  local_65c = *(int *)(p_Var10 + 0x4c);
                  if (local_65c != 10) {
                    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
                    std::ostream::put(-0x68);
                    poVar6 = (ostream *)std::ostream::flush();
                    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"        time: ",0xe);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;30m",7);
                    TestSuite::getTimeString_abi_cxx11_();
                    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                       (poVar6,(char *)local_680._0_8_,local_680._8_8_);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"      thread: ",0xe);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[33m",5);
                    pp_Var8 = poVar6->_vptr_basic_ostream;
                    *(uint *)(&poVar6->field_0x18 + (long)pp_Var8[-3]) =
                         *(uint *)(&poVar6->field_0x18 + (long)pp_Var8[-3]) & 0xffffffb5 | 8;
                    *(undefined8 *)(&poVar6->field_0x10 + (long)pp_Var8[-3]) = 4;
                    p_Var10 = (_func_int *)((long)&poVar6->_vptr_basic_ostream + (long)pp_Var8[-3]);
                    if ((&poVar6->field_0xe1)[(long)pp_Var8[-3]] == '\0') {
                      std::ios::widen((char)p_Var10);
                      p_Var10[0xe1] = (code)0x1;
                    }
                    p_Var10[0xe0] = (code)0x30;
                    local_5f8 = (element_type *)pthread_self();
                    std::_Hash_bytes(&local_5f8,8,0xc70f6907);
                    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
                    *(uint *)(&poVar6->field_0x18 + (long)poVar6->_vptr_basic_ostream[-3]) =
                         *(uint *)(&poVar6->field_0x18 + (long)poVar6->_vptr_basic_ostream[-3]) &
                         0xffffffb5 | 2;
                    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"          in: ",0xe);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[36m",5);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar6,"multiple_config_change_test",0x1b);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"()\x1b[0m",6);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"          at: ",0xe);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[32m",5);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar6,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                               ,0x6a);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m:",5);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;35m",7);
                    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x327);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar6,"    value of: \x1b[1;34ms4_conf->get_priority()\x1b[0m\n",
                               0x31);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar6,"    expected: \x1b[1;32m",0x15);
                    poVar6 = (ostream *)std::ostream::operator<<(poVar6,10);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m\n",5);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar6,"      actual: \x1b[1;31m",0x15);
                    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_65c);
                    endpoint = (string *)0x1a542a;
                    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m\n",5);
                    if ((RaftPkg *)local_680._0_8_ != (RaftPkg *)(local_680 + 0x10)) {
                      operator_delete((void *)local_680._0_8_);
                    }
                    TestSuite::failHandler();
                  }
                  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
                  }
                  if ((element_type *)local_628._8_8_ != (element_type *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_628._8_8_);
                  }
                  std::
                  vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                  ::~vector(&local_648);
                  if (local_65c == 10) goto LAB_0011f132;
                }
                else {
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
                  std::ostream::put(-0x68);
                  poVar6 = (ostream *)std::ostream::flush();
                  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"        time: ",0xe);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;30m",7);
                  TestSuite::getTimeString_abi_cxx11_();
                  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                     (poVar6,(char *)local_680._0_8_,local_680._8_8_);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"      thread: ",0xe);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[33m",5);
                  pp_Var8 = poVar6->_vptr_basic_ostream;
                  *(uint *)(&poVar6->field_0x18 + (long)pp_Var8[-3]) =
                       *(uint *)(&poVar6->field_0x18 + (long)pp_Var8[-3]) & 0xffffffb5 | 8;
                  *(undefined8 *)(&poVar6->field_0x10 + (long)pp_Var8[-3]) = 4;
                  p_Var10 = (_func_int *)((long)&poVar6->_vptr_basic_ostream + (long)pp_Var8[-3]);
                  if ((&poVar6->field_0xe1)[(long)pp_Var8[-3]] == '\0') {
                    std::ios::widen((char)p_Var10);
                    p_Var10[0xe1] = (code)0x1;
                  }
                  p_Var10[0xe0] = (code)0x30;
                  local_628._0_8_ = pthread_self();
                  std::_Hash_bytes(local_628,8,0xc70f6907);
                  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
                  *(uint *)(&poVar6->field_0x18 + (long)poVar6->_vptr_basic_ostream[-3]) =
                       *(uint *)(&poVar6->field_0x18 + (long)poVar6->_vptr_basic_ostream[-3]) &
                       0xffffffb5 | 2;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"          in: ",0xe);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[36m",5);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar6,"multiple_config_change_test",0x1b);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"()\x1b[0m",6);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"          at: ",0xe);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[32m",5);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar6,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                             ,0x6a);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m:",5);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;35m",7);
                  poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x31c);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar6,"    value of: \x1b[1;34mconfigs_out.size()\x1b[0m\n",0x2c);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar6,"    expected: \x1b[1;32m",0x15);
                  poVar6 = (ostream *)std::ostream::operator<<(poVar6,3);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m\n",5);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar6,"      actual: \x1b[1;31m",0x15);
                  poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m\n",5);
                  if ((RaftPkg *)local_680._0_8_ != (RaftPkg *)(local_680 + 0x10)) {
                    operator_delete((void *)local_680._0_8_);
                  }
                  TestSuite::failHandler();
LAB_0011f4bb:
                  std::
                  vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                  ::~vector(&local_648);
                }
                iVar4 = -1;
                goto LAB_0011f4ca;
              }
LAB_0011f132:
              __fd = (int)endpoint;
              p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&p_Var9->_M_use_count;
            } while (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_600._M_thread);
          }
          print_stats((vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> *)(local_628 + 0x10));
          nuraft::raft_server::shutdown((raft_server *)local_418,__fd,__how);
          nuraft::raft_server::shutdown
                    (local_178.raftServer.
                     super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr,__fd
                     ,__how_00);
          nuraft::raft_server::shutdown
                    (local_2c0.raftServer.
                     super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr,__fd
                     ,__how_01);
          nuraft::raft_server::shutdown
                    (local_408.raftServer.
                     super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr,__fd
                     ,__how_02);
          iVar4 = 0;
          nuraft::FakeNetworkBase::destroy
                    (local_658.
                     super___shared_ptr<nuraft::FakeNetworkBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
        }
        else {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
          std::ostream::put(-0x68);
          poVar6 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"        time: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;30m",7);
          TestSuite::getTimeString_abi_cxx11_();
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,(char *)local_680._0_8_,local_680._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"      thread: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[33m",5);
          pp_Var8 = poVar6->_vptr_basic_ostream;
          *(uint *)(&poVar6->field_0x18 + (long)pp_Var8[-3]) =
               *(uint *)(&poVar6->field_0x18 + (long)pp_Var8[-3]) & 0xffffffb5 | 8;
          *(undefined8 *)(&poVar6->field_0x10 + (long)pp_Var8[-3]) = 4;
          p_Var10 = (_func_int *)((long)&poVar6->_vptr_basic_ostream + (long)pp_Var8[-3]);
          if ((&poVar6->field_0xe1)[(long)pp_Var8[-3]] == '\0') {
            std::ios::widen((char)p_Var10);
            p_Var10[0xe1] = (code)0x1;
          }
          p_Var10[0xe0] = (code)0x30;
          local_648.
          super__Vector_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)pthread_self();
          std::_Hash_bytes(&local_648,8,0xc70f6907);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          *(uint *)(&poVar6->field_0x18 + (long)poVar6->_vptr_basic_ostream[-3]) =
               *(uint *)(&poVar6->field_0x18 + (long)poVar6->_vptr_basic_ostream[-3]) & 0xffffffb5 |
               2;
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"          in: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[36m",5);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,"multiple_config_change_test",0x1b);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"()\x1b[0m",6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"          at: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[32m",5);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                     ,0x6a);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m:",5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;35m",7);
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x312);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,
                     "    value of: \x1b[1;34mwait_for_sm_exec(pkgs, COMMIT_TIMEOUT_SEC)\x1b[0m\n",
                     0x44);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    expected: \x1b[1;32m",0x15)
          ;
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"0",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m\n",5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"      actual: \x1b[1;31m",0x15)
          ;
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,-1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m\n",5);
          if ((RaftPkg *)local_680._0_8_ != (RaftPkg *)(local_680 + 0x10)) {
            operator_delete((void *)local_680._0_8_);
          }
          iVar4 = -1;
          TestSuite::failHandler();
        }
      }
      else {
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
        std::ostream::put(-0x68);
        poVar6 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"        time: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;30m",7);
        TestSuite::getTimeString_abi_cxx11_();
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(char *)local_680._0_8_,local_680._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"      thread: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[33m",5);
        pp_Var8 = poVar6->_vptr_basic_ostream;
        *(uint *)(&poVar6->field_0x18 + (long)pp_Var8[-3]) =
             *(uint *)(&poVar6->field_0x18 + (long)pp_Var8[-3]) & 0xffffffb5 | 8;
        *(undefined8 *)(&poVar6->field_0x10 + (long)pp_Var8[-3]) = 4;
        p_Var10 = (_func_int *)((long)&poVar6->_vptr_basic_ostream + (long)pp_Var8[-3]);
        if ((&poVar6->field_0xe1)[(long)pp_Var8[-3]] == '\0') {
          std::ios::widen((char)p_Var10);
          p_Var10[0xe1] = (code)0x1;
        }
        p_Var10[0xe0] = (code)0x30;
        local_648.
        super__Vector_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)pthread_self();
        std::_Hash_bytes(&local_648,8,0xc70f6907);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        *(uint *)(&poVar6->field_0x18 + (long)poVar6->_vptr_basic_ostream[-3]) =
             *(uint *)(&poVar6->field_0x18 + (long)poVar6->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2
        ;
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"          in: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[36m",5);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"multiple_config_change_test",0x1b);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"()\x1b[0m",6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"          at: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[32m",5);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                   ,0x6a);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m:",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;35m",7);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x304);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    expected: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"\x1b[1;34m0 > ret->get_result_code()\x1b[0m\n",0x26);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    value of ",0xd);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;32m0\x1b[0m: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;31m",7);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m\n",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    value of ",0xd);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"\x1b[1;32mret->get_result_code()\x1b[0m: ",0x23);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;31m",7);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,cVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m\n",5);
        if ((RaftPkg *)local_680._0_8_ != (RaftPkg *)(local_680 + 0x10)) {
          operator_delete((void *)local_680._0_8_);
        }
        iVar4 = -1;
        TestSuite::failHandler();
      }
LAB_0011f4ca:
      if ((element_type *)local_5f0._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5f0._8_8_);
      }
    }
    else {
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
      std::ostream::put(-0x68);
      poVar6 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"        time: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;30m",7);
      TestSuite::getTimeString_abi_cxx11_();
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)local_680._0_8_,local_680._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"      thread: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[33m",5);
      pp_Var8 = poVar6->_vptr_basic_ostream;
      *(uint *)(&poVar6->field_0x18 + (long)pp_Var8[-3]) =
           *(uint *)(&poVar6->field_0x18 + (long)pp_Var8[-3]) & 0xffffffb5 | 8;
      *(undefined8 *)(&poVar6->field_0x10 + (long)pp_Var8[-3]) = 4;
      p_Var10 = (_func_int *)((long)&poVar6->_vptr_basic_ostream + (long)pp_Var8[-3]);
      if ((&poVar6->field_0xe1)[(long)pp_Var8[-3]] == '\0') {
        std::ios::widen((char)p_Var10);
        p_Var10[0xe1] = (code)0x1;
      }
      p_Var10[0xe0] = (code)0x30;
      local_648.
      super__Vector_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pthread_self();
      std::_Hash_bytes(&local_648,8,0xc70f6907);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      *(uint *)(&poVar6->field_0x18 + (long)poVar6->_vptr_basic_ostream[-3]) =
           *(uint *)(&poVar6->field_0x18 + (long)poVar6->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"          in: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[36m",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"multiple_config_change_test",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"()\x1b[0m",6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"          at: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[32m",5);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                 ,0x6a);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m:",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;35m",7);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x2fc);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"    value of: \x1b[1;34mmake_group( pkgs )\x1b[0m\n",0x2c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    expected: \x1b[1;32m",0x15);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"0",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m\n",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"      actual: \x1b[1;31m",0x15);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,-1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m\n",5);
      if ((RaftPkg *)local_680._0_8_ != (RaftPkg *)(local_680 + 0x10)) {
        operator_delete((void *)local_680._0_8_);
      }
      iVar4 = -1;
      TestSuite::failHandler();
    }
  }
  else {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    poVar6 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"        time: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;30m",7);
    TestSuite::getTimeString_abi_cxx11_();
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(char *)local_680._0_8_,local_680._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"      thread: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[33m",5);
    pp_Var8 = poVar6->_vptr_basic_ostream;
    *(uint *)(&poVar6->field_0x18 + (long)pp_Var8[-3]) =
         *(uint *)(&poVar6->field_0x18 + (long)pp_Var8[-3]) & 0xffffffb5 | 8;
    *(undefined8 *)(&poVar6->field_0x10 + (long)pp_Var8[-3]) = 4;
    p_Var10 = (_func_int *)((long)&poVar6->_vptr_basic_ostream + (long)pp_Var8[-3]);
    if ((&poVar6->field_0xe1)[(long)pp_Var8[-3]] == '\0') {
      std::ios::widen((char)p_Var10);
      p_Var10[0xe1] = (code)0x1;
    }
    p_Var10[0xe0] = (code)0x30;
    local_648.
    super__Vector_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pthread_self();
    std::_Hash_bytes(&local_648,8,0xc70f6907);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    *(uint *)(&poVar6->field_0x18 + (long)poVar6->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar6->field_0x18 + (long)poVar6->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"          in: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[36m",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"multiple_config_change_test",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"()\x1b[0m",6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"          at: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[32m",5);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
               ,0x6a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m:",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;35m",7);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x2fb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"    value of: \x1b[1;34mlaunch_servers( pkgs )\x1b[0m\n",0x30);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    expected: \x1b[1;32m",0x15);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"0",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m\n",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"      actual: \x1b[1;31m",0x15);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,-1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m\n",5);
    if ((RaftPkg *)local_680._0_8_ != (RaftPkg *)(local_680 + 0x10)) {
      operator_delete((void *)local_680._0_8_);
    }
    iVar4 = -1;
    TestSuite::failHandler();
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_628._16_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    operator_delete((void *)local_628._16_8_);
  }
  RaftPkg::~RaftPkg(&local_408);
  RaftPkg::~RaftPkg(&local_2c0);
  RaftPkg::~RaftPkg(&local_178);
  RaftPkg::~RaftPkg((RaftPkg *)(local_560 + 0x10));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_dataplus._M_p != &local_580.field_2) {
    operator_delete(local_580._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
    operator_delete(local_5e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
    operator_delete(local_5c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
    operator_delete(local_5a0._M_dataplus._M_p);
  }
  if (local_658.super___shared_ptr<nuraft::FakeNetworkBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_658.super___shared_ptr<nuraft::FakeNetworkBase,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return iVar4;
}

Assistant:

int multiple_config_change_test() {
    reset_log_files();
    ptr<FakeNetworkBase> f_base = cs_new<FakeNetworkBase>();

    std::string s1_addr = "S1";
    std::string s2_addr = "S2";
    std::string s3_addr = "S3";
    std::string s4_addr = "S4";

    RaftPkg s1(f_base, 1, s1_addr);
    RaftPkg s2(f_base, 2, s2_addr);
    RaftPkg s3(f_base, 3, s3_addr);
    RaftPkg s4(f_base, 4, s4_addr);
    std::vector<RaftPkg*> pkgs = {&s1, &s2, &s3, &s4};

    CHK_Z( launch_servers( pkgs ) );
    CHK_Z( make_group( pkgs ) );

    // Remove two nodes without waiting commit.
    s1.raftServer->remove_srv( s3.getTestMgr()->get_srv_config()->get_id() );

    // Cannot remove multiple servers at once, should return error.
    ptr<raft_result> ret =
        s1.raftServer->remove_srv( s4.getTestMgr()->get_srv_config()->get_id() );
    CHK_GT(0, ret->get_result_code());

    // Priority change is OK.
    s1.raftServer->set_priority(s4.getTestMgr()->get_srv_config()->get_id(), 10);

    // Leave req/resp.
    s1.fNet->execReqResp();
    // Leave done, notify to peers.
    s1.fNet->execReqResp();
    // Probably one more.
    s1.fNet->execReqResp();
    // Notify new commit.
    s1.fNet->execReqResp();
    // Wait for bg commit for configuration change.
    CHK_Z( wait_for_sm_exec(pkgs, COMMIT_TIMEOUT_SEC) );

    // S3 should be removed.
    for (RaftPkg* pp: pkgs) {
        if (pp->getTestMgr()->get_srv_config()->get_id() == 3) continue;

        std::vector< ptr< srv_config > > configs_out;
        pp->raftServer->get_srv_config_all(configs_out);

        // Only S1, S2, and S4 should exist.
        CHK_EQ(3, configs_out.size());
        for (auto& entry: configs_out) {
            ptr<srv_config>& s_conf = entry;
            CHK_TRUE( s_conf->get_id() == 1 ||
                      s_conf->get_id() == 2 ||
                      s_conf->get_id() == 4 );
        }

        // S4's priority should be 10.
        ptr<cluster_config> c_conf = pp->raftServer->get_config();
        ptr<srv_config> s4_conf = c_conf->get_server(4);
        CHK_EQ(10, s4_conf->get_priority());
    }

    print_stats(pkgs);

    s1.raftServer->shutdown();
    s2.raftServer->shutdown();
    s3.raftServer->shutdown();
    s4.raftServer->shutdown();

    f_base->destroy();

    return 0;
}